

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ADIOS.cpp
# Opt level: O2

Operator * __thiscall
adios2::ADIOS::DefineOperator
          (Operator *__return_storage_ptr__,ADIOS *this,string *name,string *type,Params *parameters
          )

{
  element_type *peVar1;
  string *type_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::operator+(&local_50,"for operator name ",name);
  std::operator+(&local_90,&local_50,", in call to ADIOS::DefineOperator");
  CheckPointer(this,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_50);
  peVar1 = (this->m_ADIOS).super___shared_ptr<adios2::core::ADIOS,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  std::__cxx11::string::string(local_70,(string *)type);
  type_00 = (string *)adios2::core::ADIOS::DefineOperator(peVar1,name,local_70,parameters);
  std::__cxx11::string::~string(local_70);
  Operator::Operator(__return_storage_ptr__,type_00,(Params *)(type_00 + 1));
  return __return_storage_ptr__;
}

Assistant:

Operator ADIOS::DefineOperator(const std::string name, const std::string type,
                               const Params &parameters)
{
    CheckPointer("for operator name " + name + ", in call to ADIOS::DefineOperator");
    auto op = &m_ADIOS->DefineOperator(name, type, parameters);
    return Operator(op->first, &op->second);
}